

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

int compareVideoModes(void *fp,void *sp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int sarea;
  int farea;
  int sbpp;
  int fbpp;
  GLFWvidmode *sm;
  GLFWvidmode *fm;
  void *sp_local;
  void *fp_local;
  undefined4 local_4;
  
  local_4 = *(int *)((long)fp + 8) + *(int *)((long)fp + 0xc) + *(int *)((long)fp + 0x10);
  iVar1 = *(int *)((long)sp + 8) + *(int *)((long)sp + 0xc) + *(int *)((long)sp + 0x10);
  iVar2 = *fp * *(int *)((long)fp + 4);
  iVar3 = *sp * *(int *)((long)sp + 4);
  if (local_4 == iVar1) {
    if (iVar2 == iVar3) {
      if (*fp == *sp) {
        local_4 = *(int *)((long)fp + 0x14) - *(int *)((long)sp + 0x14);
      }
      else {
        local_4 = *fp - *sp;
      }
    }
    else {
      local_4 = iVar2 - iVar3;
    }
  }
  else {
    local_4 = local_4 - iVar1;
  }
  return local_4;
}

Assistant:

static int compareVideoModes(const void* fp, const void* sp)
{
    const GLFWvidmode* fm = fp;
    const GLFWvidmode* sm = sp;
    const int fbpp = fm->redBits + fm->greenBits + fm->blueBits;
    const int sbpp = sm->redBits + sm->greenBits + sm->blueBits;
    const int farea = fm->width * fm->height;
    const int sarea = sm->width * sm->height;

    // First sort on color bits per pixel
    if (fbpp != sbpp)
        return fbpp - sbpp;

    // Then sort on screen area
    if (farea != sarea)
        return farea - sarea;

    // Then sort on width
    if (fm->width != sm->width)
        return fm->width - sm->width;

    // Lastly sort on refresh rate
    return fm->refreshRate - sm->refreshRate;
}